

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi.h
# Opt level: O3

void * stbi__tga_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  byte bVar1;
  uchar uVar2;
  byte *pbVar3;
  undefined3 uVar4;
  bool bVar5;
  byte abVar6 [4];
  bool bVar7;
  byte bVar8;
  int iVar9;
  uint x_00;
  uint uVar10;
  int iVar11;
  int iVar12;
  stbi_uc *psVar13;
  stbi_uc *psVar14;
  stbi_uc *psVar15;
  uchar *puVar16;
  uint7 uVar17;
  ulong uVar18;
  ulong uVar19;
  undefined7 uVar21;
  ulong uVar20;
  byte bVar22;
  int iVar23;
  uchar *puVar24;
  uint c;
  ulong unaff_R13;
  uint uVar25;
  long lVar26;
  ulong __n;
  bool bVar27;
  bool bVar28;
  uchar raw_data [4];
  uint local_88;
  uint local_84;
  byte local_7c [4];
  undefined8 local_78;
  undefined8 local_70;
  ulong local_68;
  uchar *local_60;
  stbi_uc *local_58;
  uint local_50;
  uint local_4c;
  stbi_uc *local_48;
  ulong local_40;
  uint local_38;
  int local_34;
  
  uVar4 = (undefined3)((uint)req_comp >> 8);
  psVar13 = s->img_buffer;
  psVar15 = s->img_buffer_end;
  local_70 = (uint *)y;
  local_58 = (stbi_uc *)x;
  if (psVar13 < psVar15) {
    s->img_buffer = psVar13 + 1;
    local_78 = (stbi_uc *)
               CONCAT44(local_78._4_4_,(int)CONCAT71((int7)((ulong)psVar13 >> 8),*psVar13));
    psVar13 = psVar13 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    local_78 = (stbi_uc *)((ulong)local_78._4_4_ << 0x20);
  }
  else {
    psVar14 = s->buffer_start;
    iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
    if (iVar9 == 0) {
      s->read_from_callbacks = 0;
      psVar15 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      local_78 = (stbi_uc *)((ulong)local_78._4_4_ << 0x20);
    }
    else {
      psVar15 = psVar14 + iVar9;
      local_78 = (stbi_uc *)
                 CONCAT44(local_78._4_4_,(int)CONCAT71((int7)((ulong)psVar13 >> 8),*psVar14));
    }
    s->img_buffer_end = psVar15;
    psVar13 = s->buffer_start + 1;
    s->img_buffer = psVar13;
  }
  if (psVar13 < psVar15) {
    s->img_buffer = psVar13 + 1;
    bVar22 = *psVar13;
    psVar13 = psVar13 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    bVar22 = 0;
  }
  else {
    psVar13 = s->buffer_start;
    iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar13,s->buflen);
    if (iVar9 == 0) {
      s->read_from_callbacks = 0;
      psVar15 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      bVar22 = 0;
    }
    else {
      psVar15 = psVar13 + iVar9;
      bVar22 = *psVar13;
    }
    s->img_buffer_end = psVar15;
    psVar13 = s->buffer_start + 1;
    s->img_buffer = psVar13;
  }
  if (psVar13 < psVar15) {
    s->img_buffer = psVar13 + 1;
    bVar1 = *psVar13;
  }
  else if (s->read_from_callbacks == 0) {
    bVar1 = 0;
  }
  else {
    psVar15 = s->buffer_start;
    iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
    if (iVar9 == 0) {
      s->read_from_callbacks = 0;
      psVar13 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      bVar1 = 0;
    }
    else {
      psVar13 = psVar15 + iVar9;
      bVar1 = *psVar15;
    }
    s->img_buffer_end = psVar13;
    s->img_buffer = s->buffer_start + 1;
  }
  iVar9 = stbi__get16le(s);
  local_4c = stbi__get16le(s);
  psVar15 = s->img_buffer;
  local_34 = req_comp;
  if (psVar15 < s->img_buffer_end) {
    s->img_buffer = psVar15 + 1;
    uVar19 = (ulong)CONCAT31(uVar4,*psVar15);
  }
  else if (s->read_from_callbacks == 0) {
    uVar19 = 0;
  }
  else {
    psVar15 = s->buffer_start;
    iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
    if (iVar11 == 0) {
      s->read_from_callbacks = 0;
      psVar13 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      uVar19 = 0;
    }
    else {
      psVar13 = psVar15 + iVar11;
      uVar19 = (ulong)CONCAT31(uVar4,*psVar15);
    }
    s->img_buffer_end = psVar13;
    s->img_buffer = s->buffer_start + 1;
  }
  stbi__get16le(s);
  stbi__get16le(s);
  x_00 = stbi__get16le(s);
  uVar10 = stbi__get16le(s);
  psVar13 = s->img_buffer;
  psVar15 = s->img_buffer_end;
  if (psVar13 < psVar15) {
    s->img_buffer = psVar13 + 1;
    local_84 = (uint)CONCAT71((int7)((ulong)psVar13 >> 8),*psVar13);
    psVar13 = psVar13 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    local_84 = 0;
  }
  else {
    psVar14 = s->buffer_start;
    iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
    if (iVar11 == 0) {
      s->read_from_callbacks = 0;
      psVar15 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      local_84 = 0;
    }
    else {
      psVar15 = psVar14 + iVar11;
      local_84 = (uint)CONCAT71((int7)((ulong)psVar13 >> 8),*psVar14);
    }
    s->img_buffer_end = psVar15;
    psVar13 = s->buffer_start + 1;
    s->img_buffer = psVar13;
    unaff_R13 = uVar19;
  }
  if (psVar13 < psVar15) {
    s->img_buffer = psVar13 + 1;
    bVar8 = *psVar13;
    uVar17 = (uint7)(unaff_R13 >> 8);
  }
  else if (s->read_from_callbacks == 0) {
    bVar8 = 0;
    uVar17 = 0;
  }
  else {
    psVar15 = s->buffer_start;
    iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
    if (iVar11 == 0) {
      s->read_from_callbacks = 0;
      psVar14 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      bVar8 = 0;
      uVar17 = 0;
    }
    else {
      psVar14 = psVar15 + iVar11;
      bVar8 = *psVar15;
      uVar17 = (uint7)((ulong)psVar13 >> 8);
    }
    s->img_buffer_end = psVar14;
    s->img_buffer = s->buffer_start + 1;
    uVar17 = uVar17 & 0xffffff;
  }
  local_7c[0] = 0;
  local_7c[1] = 0;
  local_7c[2] = 0;
  local_7c[3] = 0;
  uVar21 = (undefined7)(uVar19 >> 8);
  if (bVar22 == 0) {
    uVar25 = local_84 & 0xff;
    if (0xf < (local_84 & 0xff)) {
      if ((uVar25 == 0x20) || (uVar25 == 0x18)) {
        uVar19 = (ulong)local_84;
        goto LAB_0011516d;
      }
      if (uVar25 != 0x10) goto LAB_0011515d;
      uVar25 = bVar1 - 8;
      if (bVar1 < 8) {
        uVar25 = (uint)bVar1;
      }
      if (uVar25 != 3) goto LAB_00115139;
      uVar25 = (uint)CONCAT71(uVar21,2);
      goto LAB_00115171;
    }
    if ((local_84 & 0xff) == 8) goto LAB_0011514b;
    if (uVar25 != 0xf) goto LAB_0011515d;
LAB_00115139:
    uVar25 = (uint)CONCAT71(uVar21,3);
    bVar5 = true;
    bVar28 = false;
  }
  else {
    uVar25 = (uint)uVar19 & 0xff;
    if (uVar25 < 0x18) {
      if (uVar25 - 0xf < 2) goto LAB_00115139;
      if (uVar25 != 8) goto LAB_0011515d;
LAB_0011514b:
      bVar28 = true;
      bVar5 = false;
      uVar25 = (uint)CONCAT71(uVar21,1);
    }
    else {
      if ((uVar25 != 0x18) && (uVar25 != 0x20)) {
LAB_0011515d:
        stbi__g_failure_reason = "bad format";
        return (void *)0x0;
      }
LAB_0011516d:
      uVar25 = (uint)CONCAT71((int7)(uVar19 >> 8),(byte)uVar19 >> 3);
LAB_00115171:
      bVar28 = true;
      bVar5 = false;
    }
  }
  c = uVar25 & 0xff;
  *(uint *)local_58 = x_00;
  *local_70 = uVar10;
  if (comp != (int *)0x0) {
    *comp = c;
  }
  iVar11 = stbi__mad3sizes_valid(x_00,uVar10,c,0);
  if (iVar11 == 0) {
    stbi__g_failure_reason = "too large";
    return (void *)0x0;
  }
  local_68 = (ulong)uVar10;
  local_60 = (uchar *)stbi__malloc_mad3(x_00,uVar10,c,0);
  if (local_60 != (uchar *)0x0) {
    local_50 = (uint)CONCAT71(uVar17,bVar8 >> 5);
    local_38 = uVar25;
    stbi__skip(s,(uint)(byte)local_78);
    uVar10 = local_50;
    puVar16 = local_60;
    local_70 = (uint *)(CONCAT44(local_70._4_4_,uVar25) & 0xffffffff000000ff);
    if ((bVar1 < 8 && bVar22 == 0) && !bVar5) {
      if ((int)local_68 != 0) {
        iVar11 = x_00 * (int)local_70;
        iVar23 = 0;
        iVar9 = (int)local_68;
        do {
          iVar9 = iVar9 + -1;
          iVar12 = iVar23;
          if ((uVar10 & 1) == 0) {
            iVar12 = iVar9;
          }
          stbi__getn(s,puVar16 + iVar12 * iVar11,iVar11);
          iVar23 = iVar23 + 1;
        } while (iVar9 != 0);
      }
    }
    else {
      if (bVar22 == 0) {
        local_48 = (stbi_uc *)0x0;
      }
      else {
        stbi__skip(s,iVar9);
        uVar10 = local_4c;
        psVar15 = (stbi_uc *)stbi__malloc_mad2(local_4c,c,0);
        if (psVar15 == (stbi_uc *)0x0) {
          free(local_60);
          goto LAB_001152f0;
        }
        local_48 = psVar15;
        if (bVar28) {
          iVar9 = stbi__getn(s,psVar15,uVar10 * c);
          if (iVar9 == 0) {
            free(local_60);
            free(psVar15);
            stbi__g_failure_reason = "bad palette";
            return (void *)0x0;
          }
        }
        else {
          if (c != 3) {
            __assert_fail("tga_comp == STBI_rgb",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/stb/stbi.h"
                          ,0x15e6,
                          "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                         );
          }
          if (uVar10 != 0) {
            lVar26 = 0;
            do {
              uVar25 = stbi__get16le(s);
              psVar15[lVar26] = (stbi_uc)(((uVar25 >> 10 & 0x1f) * 0xff) / 0x1f);
              psVar15[lVar26 + 1] = (stbi_uc)(((uVar25 >> 5 & 0x1f) * 0xff) / 0x1f);
              psVar15[lVar26 + 2] = (stbi_uc)(((uVar25 & 0x1f) * 0xff) / 0x1f);
              lVar26 = lVar26 + 3;
            } while (uVar10 * 3 != (int)lVar26);
          }
        }
      }
      uVar10 = (int)local_68 * x_00;
      if (uVar10 != 0) {
        local_58 = s->buffer_start;
        local_78 = s->buffer_start + 1;
        __n = (ulong)local_70 & 0xffffffff;
        uVar19 = (ulong)uVar10;
        bVar7 = true;
        uVar18 = 0;
        local_88 = 0;
        iVar9 = 0;
        local_40 = uVar19;
        do {
          psVar15 = local_58;
          if (bVar1 < 8) {
LAB_001154b0:
            psVar15 = local_58;
            if (bVar22 == 0) {
              if (!bVar28) {
                if ((int)local_70 != 3) {
                  __assert_fail("tga_comp == STBI_rgb",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/stb/stbi.h"
                                ,0x1617,
                                "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                               );
                }
                uVar10 = stbi__get16le(s);
                abVar6 = local_7c;
                local_7c[1] = (char)(((uVar10 >> 5 & 0x1f) * 0xff) / 0x1f);
                local_7c[0] = (char)(((uVar10 >> 10 & 0x1f) * 0xff) / 0x1f);
                local_7c[3] = abVar6[3];
                local_7c[2] = (char)(((uVar10 & 0x1f) * 0xff) / 0x1f);
                goto LAB_001156ab;
              }
              if ((int)local_70 != 0) {
                psVar15 = s->img_buffer;
                psVar13 = s->img_buffer_end;
                uVar20 = 0;
                do {
                  psVar14 = local_58;
                  if (psVar15 < psVar13) {
                    s->img_buffer = psVar15 + 1;
                    bVar8 = *psVar15;
                    psVar15 = psVar15 + 1;
                  }
                  else if (s->read_from_callbacks == 0) {
                    bVar8 = 0;
                  }
                  else {
                    iVar11 = (*(s->io).read)(s->io_user_data,(char *)local_58,s->buflen);
                    if (iVar11 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      bVar8 = 0;
                      psVar13 = local_78;
                    }
                    else {
                      bVar8 = *psVar14;
                      psVar13 = psVar14 + iVar11;
                    }
                    s->img_buffer_end = psVar13;
                    s->img_buffer = local_78;
                    psVar15 = local_78;
                  }
                  local_7c[uVar20] = bVar8;
                  uVar20 = uVar20 + 1;
                  uVar19 = local_40;
                } while (__n != uVar20);
                goto LAB_00115591;
              }
            }
            else {
              if ((char)local_84 == '\b') {
                pbVar3 = s->img_buffer;
                if (pbVar3 < s->img_buffer_end) {
                  s->img_buffer = pbVar3 + 1;
                  bVar8 = *pbVar3;
                }
                else if (s->read_from_callbacks == 0) {
                  bVar8 = 0;
                }
                else {
                  iVar11 = (*(s->io).read)(s->io_user_data,(char *)local_58,s->buflen);
                  if (iVar11 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar8 = 0;
                    psVar15 = local_78;
                  }
                  else {
                    bVar8 = *psVar15;
                    psVar15 = psVar15 + iVar11;
                  }
                  s->img_buffer_end = psVar15;
                  s->img_buffer = local_78;
                  uVar19 = local_40;
                }
                uVar10 = (uint)bVar8;
              }
              else {
                uVar10 = stbi__get16le(s);
              }
              if ((int)local_70 != 0) {
                if (local_4c <= uVar10) {
                  uVar10 = 0;
                }
                memcpy(local_7c,local_48 + uVar10 * (int)local_70,__n);
LAB_001156ab:
                memcpy(local_60 + (uint)((int)local_70 * (int)uVar18),local_7c,__n);
              }
            }
          }
          else {
            if (iVar9 == 0) {
              pbVar3 = s->img_buffer;
              if (pbVar3 < s->img_buffer_end) {
                s->img_buffer = pbVar3 + 1;
                bVar8 = *pbVar3;
              }
              else if (s->read_from_callbacks == 0) {
                bVar8 = 0;
              }
              else {
                iVar9 = (*(s->io).read)(s->io_user_data,(char *)local_58,s->buflen);
                if (iVar9 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  bVar8 = 0;
                  psVar15 = local_78;
                }
                else {
                  bVar8 = *psVar15;
                  psVar15 = psVar15 + iVar9;
                }
                s->img_buffer_end = psVar15;
                s->img_buffer = local_78;
              }
              iVar9 = (bVar8 & 0x7f) + 1;
              local_88 = (uint)(bVar8 >> 7);
              goto LAB_001154b0;
            }
            bVar27 = local_88 != 0;
            local_88 = 1;
            if (!bVar27 || bVar7) {
              local_88 = (uint)bVar27;
              goto LAB_001154b0;
            }
LAB_00115591:
            if ((int)local_70 != 0) goto LAB_001156ab;
          }
          iVar9 = iVar9 + -1;
          uVar18 = uVar18 + 1;
          bVar7 = false;
        } while (uVar18 != uVar19);
      }
      puVar16 = local_60;
      if ((local_50 & 1) == 0 && (int)local_68 != 0) {
        iVar9 = x_00 * (int)local_70;
        iVar11 = iVar9 * ((int)local_68 - 1U);
        uVar25 = 0;
        uVar10 = 0;
        do {
          if (iVar9 != 0) {
            puVar24 = local_60;
            iVar23 = iVar9 + 1;
            do {
              uVar2 = puVar24[uVar25];
              puVar24[uVar25] = puVar24[iVar11];
              puVar24[iVar11] = uVar2;
              puVar24 = puVar24 + 1;
              iVar23 = iVar23 + -1;
            } while (1 < iVar23);
          }
          iVar11 = iVar11 - iVar9;
          uVar25 = uVar25 + iVar9;
          bVar28 = uVar10 != (int)local_68 - 1U >> 1;
          uVar10 = uVar10 + 1;
        } while (bVar28);
      }
      if (local_48 != (stbi_uc *)0x0) {
        free(local_48);
      }
    }
    if ((!bVar5 && 2 < (byte)local_38) && (iVar9 = (uint)local_68 * x_00, iVar9 != 0)) {
      puVar24 = puVar16 + 2;
      do {
        uVar2 = puVar24[-2];
        puVar24[-2] = *puVar24;
        *puVar24 = uVar2;
        puVar24 = puVar24 + ((ulong)local_70 & 0xffffffff);
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
    if (local_34 != 0) {
      if ((int)local_70 != local_34) {
        puVar16 = stbi__convert_format(puVar16,(int)local_70,local_34,x_00,(uint)local_68);
        return puVar16;
      }
      return puVar16;
    }
    return puVar16;
  }
LAB_001152f0:
  stbi__g_failure_reason = "outofmem";
  return (void *)0x0;
}

Assistant:

static void *stbi__tga_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   //   read in the TGA header stuff
   int tga_offset = stbi__get8(s);
   int tga_indexed = stbi__get8(s);
   int tga_image_type = stbi__get8(s);
   int tga_is_RLE = 0;
   int tga_palette_start = stbi__get16le(s);
   int tga_palette_len = stbi__get16le(s);
   int tga_palette_bits = stbi__get8(s);
   int tga_x_origin = stbi__get16le(s);
   int tga_y_origin = stbi__get16le(s);
   int tga_width = stbi__get16le(s);
   int tga_height = stbi__get16le(s);
   int tga_bits_per_pixel = stbi__get8(s);
   int tga_comp, tga_rgb16=0;
   int tga_inverted = stbi__get8(s);
   // int tga_alpha_bits = tga_inverted & 15; // the 4 lowest bits - unused (useless?)
   //   image data
   unsigned char *tga_data;
   unsigned char *tga_palette = NULL;
   int i, j;
   unsigned char raw_data[4] = {0};
   int RLE_count = 0;
   int RLE_repeating = 0;
   int read_next_pixel = 1;
   STBI_NOTUSED(ri);
   STBI_NOTUSED(tga_x_origin); // @TODO
   STBI_NOTUSED(tga_y_origin); // @TODO

   //   do a tiny bit of precessing
   if ( tga_image_type >= 8 )
   {
      tga_image_type -= 8;
      tga_is_RLE = 1;
   }
   tga_inverted = 1 - ((tga_inverted >> 5) & 1);

   //   If I'm paletted, then I'll use the number of bits from the palette
   if ( tga_indexed ) tga_comp = stbi__tga_get_comp(tga_palette_bits, 0, &tga_rgb16);
   else tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3), &tga_rgb16);

   if(!tga_comp) // shouldn't really happen, stbi__tga_test() should have ensured basic consistency
      return stbi__errpuc("bad format", "Can't find out TGA pixelformat");

   //   tga info
   *x = tga_width;
   *y = tga_height;
   if (comp) *comp = tga_comp;

   if (!stbi__mad3sizes_valid(tga_width, tga_height, tga_comp, 0))
      return stbi__errpuc("too large", "Corrupt TGA");

   tga_data = (unsigned char*)stbi__malloc_mad3(tga_width, tga_height, tga_comp, 0);
   if (!tga_data) return stbi__errpuc("outofmem", "Out of memory");

   // skip to the data's starting position (offset usually = 0)
   stbi__skip(s, tga_offset );

   if ( !tga_indexed && !tga_is_RLE && !tga_rgb16 ) {
      for (i=0; i < tga_height; ++i) {
         int row = tga_inverted ? tga_height -i - 1 : i;
         stbi_uc *tga_row = tga_data + row*tga_width*tga_comp;
         stbi__getn(s, tga_row, tga_width * tga_comp);
      }
   } else  {
      //   do I need to load a palette?
      if ( tga_indexed)
      {
         //   any data to skip? (offset usually = 0)
         stbi__skip(s, tga_palette_start );
         //   load the palette
         tga_palette = (unsigned char*)stbi__malloc_mad2(tga_palette_len, tga_comp, 0);
         if (!tga_palette) {
            STBI_FREE(tga_data);
            return stbi__errpuc("outofmem", "Out of memory");
         }
         if (tga_rgb16) {
            stbi_uc *pal_entry = tga_palette;
            STBI_ASSERT(tga_comp == STBI_rgb);
            for (i=0; i < tga_palette_len; ++i) {
               stbi__tga_read_rgb16(s, pal_entry);
               pal_entry += tga_comp;
            }
         } else if (!stbi__getn(s, tga_palette, tga_palette_len * tga_comp)) {
               STBI_FREE(tga_data);
               STBI_FREE(tga_palette);
               return stbi__errpuc("bad palette", "Corrupt TGA");
         }
      }
      //   load the data
      for (i=0; i < tga_width * tga_height; ++i)
      {
         //   if I'm in RLE mode, do I need to get a RLE stbi__pngchunk?
         if ( tga_is_RLE )
         {
            if ( RLE_count == 0 )
            {
               //   yep, get the next byte as a RLE command
               int RLE_cmd = stbi__get8(s);
               RLE_count = 1 + (RLE_cmd & 127);
               RLE_repeating = RLE_cmd >> 7;
               read_next_pixel = 1;
            } else if ( !RLE_repeating )
            {
               read_next_pixel = 1;
            }
         } else
         {
            read_next_pixel = 1;
         }
         //   OK, if I need to read a pixel, do it now
         if ( read_next_pixel )
         {
            //   load however much data we did have
            if ( tga_indexed )
            {
               // read in index, then perform the lookup
               int pal_idx = (tga_bits_per_pixel == 8) ? stbi__get8(s) : stbi__get16le(s);
               if ( pal_idx >= tga_palette_len ) {
                  // invalid index
                  pal_idx = 0;
               }
               pal_idx *= tga_comp;
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = tga_palette[pal_idx+j];
               }
            } else if(tga_rgb16) {
               STBI_ASSERT(tga_comp == STBI_rgb);
               stbi__tga_read_rgb16(s, raw_data);
            } else {
               //   read in the data raw
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = stbi__get8(s);
               }
            }
            //   clear the reading flag for the next pixel
            read_next_pixel = 0;
         } // end of reading a pixel

         // copy data
         for (j = 0; j < tga_comp; ++j)
           tga_data[i*tga_comp+j] = raw_data[j];

         //   in case we're in RLE mode, keep counting down
         --RLE_count;
      }
      //   do I need to invert the image?
      if ( tga_inverted )
      {
         for (j = 0; j*2 < tga_height; ++j)
         {
            int index1 = j * tga_width * tga_comp;
            int index2 = (tga_height - 1 - j) * tga_width * tga_comp;
            for (i = tga_width * tga_comp; i > 0; --i)
            {
               unsigned char temp = tga_data[index1];
               tga_data[index1] = tga_data[index2];
               tga_data[index2] = temp;
               ++index1;
               ++index2;
            }
         }
      }
      //   clear my palette, if I had one
      if ( tga_palette != NULL )
      {
         STBI_FREE( tga_palette );
      }
   }

   // swap RGB - if the source data was RGB16, it already is in the right order
   if (tga_comp >= 3 && !tga_rgb16)
   {
      unsigned char* tga_pixel = tga_data;
      for (i=0; i < tga_width * tga_height; ++i)
      {
         unsigned char temp = tga_pixel[0];
         tga_pixel[0] = tga_pixel[2];
         tga_pixel[2] = temp;
         tga_pixel += tga_comp;
      }
   }

   // convert to target component count
   if (req_comp && req_comp != tga_comp)
      tga_data = stbi__convert_format(tga_data, tga_comp, req_comp, tga_width, tga_height);

   //   the things I do to get rid of an error message, and yet keep
   //   Microsoft's C compilers happy... [8^(
   tga_palette_start = tga_palette_len = tga_palette_bits =
         tga_x_origin = tga_y_origin = 0;
   STBI_NOTUSED(tga_palette_start);
   //   OK, done
   return tga_data;
}